

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_movep(DisasContext_conflict6 *ctx,int enc_dest,int enc_rt,int enc_rs)

{
  int iVar1;
  int iVar2;
  TCGContext_conflict6 *tcg_ctx;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  iVar1 = gen_movep::re_enc[(uint)enc_dest];
  iVar2 = gen_movep::rs_rt_enc[(uint)enc_rt];
  if (enc_rs == 0) {
    tcg_gen_movi_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[gen_movep::rd_enc[(uint)enc_dest]],0);
  }
  else {
    tcg_gen_mov_i64_mips64el
              (tcg_ctx,tcg_ctx->cpu_gpr[gen_movep::rd_enc[(uint)enc_dest]],
               tcg_ctx->cpu_gpr[gen_movep::rs_rt_enc[(uint)enc_rs]]);
  }
  if (enc_rt != 0) {
    tcg_gen_mov_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[iVar1],tcg_ctx->cpu_gpr[iVar2]);
    return;
  }
  tcg_gen_movi_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[iVar1],0);
  return;
}

Assistant:

static inline void gen_movep(DisasContext *ctx, int enc_dest, int enc_rt,
                             int enc_rs)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rd, rs, re, rt;
    static const int rd_enc[] = { 5, 5, 6, 4, 4, 4, 4, 4 };
    static const int re_enc[] = { 6, 7, 7, 21, 22, 5, 6, 7 };
    static const int rs_rt_enc[] = { 0, 17, 2, 3, 16, 18, 19, 20 };
    rd = rd_enc[enc_dest];
    re = re_enc[enc_dest];
    rs = rs_rt_enc[enc_rs];
    rt = rs_rt_enc[enc_rt];
    if (rs) {
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs]);
    } else {
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
    }
    if (rt) {
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[re], tcg_ctx->cpu_gpr[rt]);
    } else {
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[re], 0);
    }
}